

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

Error * ot::commissioner::ActiveDatasetFromJson
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,string *aJson)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  writer write;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_160;
  string local_150;
  writer local_130;
  _Any_data local_128;
  code *local_118;
  undefined8 uStack_110;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  char local_d0 [24];
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_b8;
  pointer local_a0;
  pointer local_88;
  pointer local_70;
  pointer local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_108);
  ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_108);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88);
  }
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_b8);
  if (local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p);
  }
  if ((pointer)local_108._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._8_8_);
  }
  StripComments((string *)local_108,aJson);
  first._M_current._4_4_ = local_108._4_4_;
  first._M_current._0_4_ = local_108._0_4_;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_178,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_108._8_8_ + first._M_current));
  local_118 = (code *)0x0;
  uStack_110 = 0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_188,(input_adapter *)local_178,(parser_callback_t *)&local_128,true);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  if ((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_) != local_108 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_));
  }
  if (local_188[0] == null) {
    local_108._0_4_ = none_type;
    from = "Empty active operational dataset JSON";
    local_108._8_8_ = "Empty active operational dataset JSON";
    local_108._16_8_ = (pointer)0x25;
    local_108._24_8_ = (pointer)0x0;
    local_e0._M_p = (char *)0x0;
    local_130.handler_ = (format_string_checker<char> *)local_108;
    local_108._32_8_ = (format_string_checker<char> *)local_108;
    do {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_130,from,"");
          goto LAB_0016de54;
        }
        cVar1 = *to;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_130,from,to);
      from = fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_108);
    } while (from != "");
LAB_0016de54:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    fmt::v10::vformat_abi_cxx11_
              (&local_150,(v10 *)"Empty active operational dataset JSON",(string_view)ZEXT816(0x25),
               args);
    local_178._0_4_ = kNotFound;
    local_170._M_pi = &local_160;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    __return_storage_ptr__->mCode = local_178._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_170);
    if (local_170._M_pi != &local_160) {
      operator_delete(local_170._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_0016dd85;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::ActiveOperationalDataset,_ot::commissioner::ActiveOperationalDataset,_0>
              ((ActiveOperationalDataset *)local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_188);
    ActiveOperationalDataset::operator=(aDataset,(ActiveOperationalDataset *)local_108);
    if (local_50 != (pointer)0x0) {
      operator_delete(local_50);
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70);
    }
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88);
    }
    if (local_a0 != (pointer)0x0) {
      operator_delete(local_a0);
    }
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_b8);
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)local_108._8_8_;
    if ((pointer)local_108._8_8_ == (pointer)0x0) goto LAB_0016dd85;
  }
  operator_delete(local_150._M_dataplus._M_p);
LAB_0016dd85:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_188);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_188 + 8),local_188[0]);
  return __return_storage_ptr__;
}

Assistant:

Error ActiveDatasetFromJson(ActiveOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = ActiveOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty active operational dataset JSON");
        }
        else
        {
            aDataset = json;
        }

    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}